

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_saver_exit_example.cpp
# Opt level: O1

int main(void)

{
  int *a_00;
  uint in_EAX;
  long *plVar1;
  undefined8 extraout_RAX;
  int a;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"main a = ",9);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,0);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  foo1((int *)((long)&uStack_28 + 4));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"main a = ",9);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,uStack_28._4_4_);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  foo2((int *)((long)&uStack_28 + 4));
  __cxa_begin_catch(extraout_RAX);
  __cxa_end_catch();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"main a = ",9);
  a_00 = (int *)((long)&uStack_28 + 4);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,uStack_28._4_4_);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  foo3(a_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"main a = ",9);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,uStack_28._4_4_);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  foo4(a_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"main a = ",9);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,uStack_28._4_4_);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  foo5(a_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"main a = ",9);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,uStack_28._4_4_);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  foo6(a_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"main a = ",9);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,uStack_28._4_4_);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  return 0;
}

Assistant:

int main() {
  int a = 0;
  std::cout << "main a = " << a << std::endl;

  foo1(a);
  std::cout << "main a = " << a << std::endl;

  try {
    foo2(a);
  } catch (...) {}
  std::cout << "main a = " << a << std::endl;

  foo3(a);
  std::cout << "main a = " << a << std::endl;

  foo4(a);
  std::cout << "main a = " << a << std::endl;

  foo5(a);
  std::cout << "main a = " << a << std::endl;

  foo6(a);
  std::cout << "main a = " << a << std::endl;

  return 0;
}